

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O1

CMConnection Tunneling_get_conn(CManager cm,attr_list attrs)

{
  int iVar1;
  in_addr_t iVar2;
  int __fd;
  int iVar3;
  char *__name;
  hostent *phVar4;
  ssize_t sVar5;
  CMConnection p_Var6;
  long lVar7;
  uint uVar8;
  bool bVar9;
  int DestinationIP;
  char *DestinationHostStr;
  int DestinationPort;
  char *group_id;
  int forward_port;
  char IPstr [16];
  anon_union_16_2_c960cb83 sock_addr;
  char msg [256];
  char request [1024];
  char recv_buffer [2048];
  int local_d84;
  char *local_d80;
  undefined4 local_d74;
  CManager local_d70;
  undefined8 local_d68;
  uint local_d5c;
  char local_d58 [16];
  sockaddr local_d48;
  undefined1 local_d38 [256];
  char local_c38 [1024];
  uint local_838 [514];
  
  local_d68 = 0;
  iVar1 = get_string_attr(attrs);
  if (iVar1 == 0) {
LAB_00742a76:
    p_Var6 = (CMConnection)CMget_conn(cm,attrs);
  }
  else {
    memset(local_c38,0,0x400);
    iVar1 = get_int_attr(attrs,IP_PORT_ATOM,&local_d74);
    if (iVar1 == 0) {
      Tunneling_get_conn_cold_3();
    }
    else {
      iVar1 = get_int_attr(attrs,IP_ADDR_ATOM,&local_d84);
      if (iVar1 == 0) {
        local_d84 = 0;
      }
      iVar1 = get_string_attr(attrs,IP_HOST_ATOM,&local_d80);
      if (iVar1 == 0) {
        Tunneling_get_conn_cold_1();
      }
      if ((local_d80 == (char *)0x0) && (local_d84 == 0)) {
        Tunneling_get_conn_cold_2();
      }
      else {
        if (local_d80 == (char *)0x0) {
          inet_ntop(2,&local_d84,local_d58,0x10);
          local_d80 = local_d58;
        }
        iVar1 = snprintf(local_c38,0x400,"/connect_port?group=%s&service=%s&dhost=%s&dport=%d",
                         local_d68,"service_5",local_d80,local_d74);
        __name = getenv("TUNNEL_SERVER_HOST");
        if (__name == (char *)0x0) {
          uVar8 = 0x7f000001;
        }
        else {
          phVar4 = gethostbyname(__name);
          if (phVar4 == (hostent *)0x0) {
            iVar2 = inet_addr(__name);
            bVar9 = iVar2 != 0xffffffff;
            uVar8 = 0x7f000001;
            if (bVar9) {
              uVar8 = iVar2;
            }
          }
          else {
            memcpy(local_838,*phVar4->h_addr_list,(long)phVar4->h_length);
            bVar9 = true;
            uVar8 = local_838[0] >> 0x18 | (local_838[0] & 0xff0000) >> 8 |
                    (local_838[0] & 0xff00) << 8 | local_838[0] << 0x18;
          }
          if (!bVar9) goto LAB_00742a9d;
        }
        local_d48.sa_family = 2;
        local_d48.sa_data[0] = 'u';
        local_d48.sa_data[1] = '0';
        local_d48.sa_data._2_4_ =
             uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        __fd = socket(2,1,0);
        iVar3 = connect(__fd,&local_d48,0x10);
        if (iVar3 != -1) {
          iVar3 = 0;
          local_d70 = cm;
          printf("Request is \"%s\"\n",local_c38);
          if (0 < iVar1) {
            do {
              sVar5 = write(__fd,local_c38 + iVar3,(long)(iVar1 - iVar3));
              if ((int)sVar5 == -1) {
                puts("Error");
              }
              iVar3 = iVar3 + (int)sVar5;
            } while (iVar3 < iVar1);
          }
          cm = local_d70;
          lVar7 = 0;
          do {
            sVar5 = read(__fd,(void *)((long)local_838 + lVar7),(long)(0x800 - (int)lVar7));
            iVar1 = (int)sVar5;
            if (iVar1 == 0) {
              bVar9 = false;
            }
            else {
              if (iVar1 == -1) {
                puts("Error");
              }
              lVar7 = lVar7 + iVar1;
              bVar9 = true;
            }
          } while (bVar9);
          close(__fd);
          printf("We got %s from the tunnel server\n",local_838);
          __isoc99_sscanf(local_838,"port:%d,msg:%s",&local_d5c,local_d38);
          printf("Forward port is %d\n",(ulong)local_d5c);
          attrs = (attr_list)create_attr_list();
          add_attr(attrs,IP_PORT_ATOM,1,(long)(int)local_d5c);
          add_attr(attrs,IP_ADDR_ATOM,1,(long)(int)uVar8);
          goto LAB_00742a76;
        }
        puts("connect Error");
      }
    }
LAB_00742a9d:
    p_Var6 = (CMConnection)0x0;
  }
  return p_Var6;
}

Assistant:

CMConnection Tunneling_get_conn(CManager cm, attr_list attrs)
{
    char *group_id = NULL;
    if (get_string_attr(attrs, SST_GROUP_ID_ATOM, &group_id))
    {
        attr_list conn_attrs;
        // do the tunneling
        char request[1024] = {'\0'};
        const char *format_string = "/connect_port?group=%s&service=%s&dhost=%s&dport=%d";
        int DestinationIP;
        int DestinationPort;
        char *DestinationHostStr;
        if (!get_int_attr(attrs, IP_PORT_ATOM, &DestinationPort))
        {
            fprintf(stderr, "No IP_PORT atom\n");
            return NULL;
        }
        if (!get_int_attr(attrs, IP_ADDR_ATOM, &DestinationIP))
        {
            DestinationIP = 0;
        }
        if (!get_string_attr(attrs, IP_HOST_ATOM, &DestinationHostStr))
        {
            fprintf(stderr, "No IP_HOST");
            DestinationHostStr = NULL;
        }
        char IPstr[INET_ADDRSTRLEN];
        if ((DestinationHostStr == NULL) && (DestinationIP == 0))
        {
            fprintf(stderr, "NO IP or Hostname for tunnel\n");
            return NULL;
        }
        else if (DestinationHostStr == NULL)
        {
            inet_ntop(AF_INET, &DestinationIP, IPstr, INET_ADDRSTRLEN);
            DestinationHostStr = &IPstr[0];
        }
        int request_len = snprintf(request, sizeof(request), format_string, group_id, "service_5",
                                   DestinationHostStr, DestinationPort);
        union
        {
            struct sockaddr s;
            struct sockaddr_in s_I4;
        } sock_addr;

        int server_addr = INADDR_LOOPBACK;
        char *server_hostname = getenv("TUNNEL_SERVER_HOST");
        if (server_hostname)
        {
            struct hostent *host_addr;
            host_addr = gethostbyname(server_hostname);
            if (host_addr == NULL)
            {
                int _addr;
                _addr = inet_addr(server_hostname);
                if (_addr == -1)
                {
                    /*
                     *  not translatable as a hostname or
                     * as a dot-style string IP address
                     */
                    return 0;
                }
                if (sizeof(int) == sizeof(struct in_addr))
                    server_addr = (int)_addr;
                else
                {
                    printf("Bad struct size\n");
                    return NULL;
                }
            }
            else
            {
                int tmp;
                memcpy(&tmp, host_addr->h_addr, host_addr->h_length);
                server_addr = ntohl(tmp);
            }
        }
        sock_addr.s_I4.sin_family = AF_INET;
        sock_addr.s_I4.sin_addr.s_addr = htonl(server_addr);
        sock_addr.s_I4.sin_port = htons(30000);

        int sock = socket(AF_INET, SOCK_STREAM, 0);
        /* Actually connect. */
        if (connect(sock, (struct sockaddr *)&sock_addr.s_I4, sizeof(sock_addr)) == -1)
        {
            printf("connect Error\n");
            return NULL;
        }

        /* Send request. */
        printf("Request is \"%s\"\n", request);
        int nbytes_total = 0;
        while (nbytes_total < request_len)
        {
            int nbytes_last = write(sock, request + nbytes_total, request_len - nbytes_total);
            if (nbytes_last == -1)
                printf("Error\n");
            nbytes_total += nbytes_last;
        }

        /* Read the response. */
        size_t bytes_recd = 0;
        char recv_buffer[2048];
        while (1)
        {
            size_t remaining = sizeof(recv_buffer) - bytes_recd;
            int read_len = remaining;
            nbytes_total = read(sock, recv_buffer + bytes_recd, read_len);
            if (nbytes_total == 0)
            {
                break;
            }
            if (nbytes_total == -1)
            {
                printf("Error\n");
            }
            bytes_recd += nbytes_total;
        }

        close(sock);
        printf("We got %s from the tunnel server\n", recv_buffer);
        char msg[256];
        int forward_port;
        sscanf(recv_buffer, "port:%d,msg:%s", &forward_port, &msg[0]);
        printf("Forward port is %d\n", forward_port);
        conn_attrs = create_attr_list();
        add_attr(conn_attrs, IP_PORT_ATOM, Attr_Int4, (attr_value)(intptr_t)forward_port);

        add_attr(conn_attrs, IP_ADDR_ATOM, Attr_Int4, (attr_value)server_addr);

        return CMget_conn(cm, conn_attrs);
    }
    else
    {
        return CMget_conn(cm, attrs);
    }
}